

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<OneLevel,_OneLevel>::Resize(TArray<OneLevel,_OneLevel> *this,uint amount)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint amount_00;
  FString *pFVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar1 = this->Count;
  amount_00 = amount - uVar1;
  if (amount < uVar1 || amount_00 == 0) {
    if (amount_00 != 0) {
      DoDelete(this,amount,uVar1 - 1);
    }
  }
  else {
    Grow(this,amount_00);
    auVar3 = _DAT_005d6240;
    auVar2 = _DAT_005d6230;
    uVar1 = this->Count;
    if (uVar1 < amount) {
      lVar5 = (ulong)amount - (ulong)uVar1;
      lVar6 = lVar5 + -1;
      auVar8._8_4_ = (int)lVar6;
      auVar8._0_8_ = lVar6;
      auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
      pFVar4 = &this->Array[(ulong)uVar1 + 1].Levelname;
      uVar7 = 0;
      auVar8 = auVar8 ^ _DAT_005d6240;
      do {
        auVar9._8_4_ = (int)uVar7;
        auVar9._0_8_ = uVar7;
        auVar9._12_4_ = (int)(uVar7 >> 0x20);
        auVar9 = (auVar9 | auVar2) ^ auVar3;
        if ((bool)(~(auVar9._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar9._0_4_ ||
                    auVar8._4_4_ < auVar9._4_4_) & 1)) {
          pFVar4[-4] = (char *)0x723dac;
        }
        if ((auVar9._12_4_ != auVar8._12_4_ || auVar9._8_4_ <= auVar8._8_4_) &&
            auVar9._12_4_ <= auVar8._12_4_) {
          pFVar4->Chars = (char *)0x723dac;
        }
        uVar7 = uVar7 + 2;
        pFVar4 = pFVar4 + 8;
      } while ((lVar5 + 1U & 0xfffffffffffffffe) != uVar7);
      FString::NullString.RefCount = (FString::NullString.RefCount + amount) - uVar1;
    }
  }
  this->Count = amount;
  return;
}

Assistant:

void Resize (unsigned int amount)
	{
		if (Count < amount)
		{
			// Adding new entries
			Grow (amount - Count);
			for (unsigned int i = Count; i < amount; ++i)
			{
				::new((void *)&Array[i]) T;
			}
		}
		else if (Count != amount)
		{
			// Deleting old entries
			DoDelete (amount, Count - 1);
		}
		Count = amount;
	}